

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O0

char * choc::text::FloatToStringBuffer<float>::addDecimalPointAndExponent
                 (char *pos,uint32_t totalLength,int K,int maxDecimalPlaces)

{
  uint32_t mantissaLength;
  int mantissaDigits;
  int maxDecimalPlaces_local;
  int K_local;
  uint32_t totalLength_local;
  char *pos_local;
  
  mantissaLength = totalLength + K;
  if (SBORROW4(mantissaLength,-maxDecimalPlaces) == (int)(mantissaLength + maxDecimalPlaces) < 0) {
    if (((int)mantissaLength < 1) && (-6 < (int)mantissaLength)) {
      pos_local = writeWithoutExponentLessThan1(pos,totalLength,mantissaLength,maxDecimalPlaces);
    }
    else if (((int)mantissaLength < 1) || (0x15 < (int)mantissaLength)) {
      pos_local = writeAsExponentNotation(pos,totalLength,mantissaLength - 1);
    }
    else {
      pos_local = writeWithoutExponentGreaterThan1
                            (pos,totalLength,mantissaLength,maxDecimalPlaces,K);
    }
  }
  else {
    pos_local = writeZero(pos);
  }
  return pos_local;
}

Assistant:

static const char* addDecimalPointAndExponent (char* pos, uint32_t totalLength, int K, int maxDecimalPlaces)
    {
        auto mantissaDigits = static_cast<int> (totalLength) + K;

        if (mantissaDigits < -maxDecimalPlaces)          return writeZero (pos);
        if (mantissaDigits <= 0 && mantissaDigits > -6)  return writeWithoutExponentLessThan1 (pos, totalLength, mantissaDigits, maxDecimalPlaces);
        if (mantissaDigits > 0 && mantissaDigits <= 21)  return writeWithoutExponentGreaterThan1 (pos, totalLength, static_cast<uint32_t> (mantissaDigits), maxDecimalPlaces, K);

        return writeAsExponentNotation (pos, totalLength, mantissaDigits - 1);
    }